

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sVertexArrayTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Stress::anon_unknown_1::SingleVertexArrayFirstTests::init
          (SingleVertexArrayFirstTests *this,EVP_PKEY_CTX *ctx)

{
  int offset_;
  int t;
  GLValue max_;
  TestNode *this_00;
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  long *plVar3;
  undefined8 *puVar4;
  MultiVertexArrayTest *this_01;
  undefined8 uVar5;
  ulong *puVar6;
  InputType type;
  long lVar7;
  ulong uVar8;
  InputType type_00;
  bool bVar9;
  GLValue GVar10;
  string name;
  Spec spec;
  ArraySpec arraySpec;
  long local_290;
  long *local_288;
  undefined8 local_280;
  long local_278;
  undefined8 uStack_270;
  long *local_268;
  undefined8 local_260;
  long local_258;
  undefined8 uStack_250;
  ulong *local_248;
  long local_240;
  ulong local_238;
  long lStack_230;
  ulong *local_228;
  long local_220;
  ulong local_218;
  long lStack_210;
  uint local_204;
  uint local_200;
  uint local_1fc;
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8;
  long lStack_1e0;
  ulong *local_1d8;
  long local_1d0;
  ulong local_1c8;
  long lStack_1c0;
  long *local_1b8;
  undefined8 local_1b0;
  long local_1a8;
  undefined8 uStack_1a0;
  long *local_198;
  undefined8 local_190;
  long local_188;
  undefined8 uStack_180;
  long local_178;
  long local_170;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  TestNode *local_e8;
  long local_e0;
  undefined1 local_d8 [16];
  pointer local_c8;
  pointer pAStack_c0;
  pointer local_b8;
  string local_b0;
  InputType local_90;
  undefined4 uStack_8c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_88;
  InputType local_80;
  undefined4 uStack_7c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_78;
  ArraySpec local_70;
  
  local_290 = 0;
  local_e8 = (TestNode *)this;
  do {
    in_RAX = CONCAT71((int7)((ulong)in_RAX >> 8),1);
    local_178 = 0;
    do {
      local_204 = (uint)in_RAX;
      uVar5 = CONCAT71((int7)((ulong)in_RAX >> 8),1);
      local_170 = 0;
      do {
        local_200 = (uint)uVar5;
        local_e0 = 0;
        do {
          uVar5 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
          lVar7 = 0;
          do {
            local_1fc = (uint)uVar5;
            if (local_e0 == 0) {
              type_00 = *(InputType *)(&DAT_006650c0 + local_290 * 4);
              iVar1 = deqp::gls::Array::inputTypeSize(type_00);
              iVar1 = iVar1 * 2;
            }
            else {
              iVar1 = (&DAT_006650cc)[local_e0];
              type_00 = *(InputType *)(&DAT_006650c0 + local_290 * 4);
            }
            iVar2 = deqp::gls::Array::inputTypeSize(type_00);
            offset_ = *(int *)(&DAT_006650d8 + local_178 * 4);
            if (iVar1 % iVar2 == 0) {
              iVar2 = deqp::gls::Array::inputTypeSize(type_00);
              bVar9 = offset_ % iVar2 == 0;
            }
            else {
              bVar9 = false;
            }
            GVar10 = deqp::gls::GLValue::getMinValue(type_00);
            aStack_78 = GVar10.field_1;
            local_80 = GVar10.type;
            GVar10 = deqp::gls::GLValue::getMaxValue(type_00);
            aStack_88 = GVar10.field_1;
            local_90 = GVar10.type;
            max_._4_4_ = uStack_8c;
            max_.type = local_90;
            GVar10._4_4_ = uStack_7c;
            GVar10.type = local_80;
            GVar10.field_1 = aStack_78;
            max_.field_1 = aStack_88;
            deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                      (&local_70,type_00,OUTPUTTYPE_VEC2,STORAGE_BUFFER,USAGE_DYNAMIC_DRAW,2,offset_
                       ,iVar1,false,GVar10,max_);
            local_c8 = (pointer)0x0;
            pAStack_c0 = (pointer)0x0;
            local_b8 = (pointer)0x0;
            local_d8._0_4_ = PRIMITIVE_TRIANGLES;
            iVar2 = *(int *)(&DAT_00640878 + local_170 * 4);
            t = (&DAT_00640880)[lVar7];
            local_d8._4_4_ = iVar2;
            local_d8._8_4_ = t;
            std::
            vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
            ::_M_realloc_insert<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec_const&>
                      ((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                        *)&local_c8,(iterator)0x0,&local_70);
            deqp::gls::Array::inputTypeToString_abi_cxx11_(&local_b0,(Array *)(ulong)type_00,type);
            plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
            local_248 = &local_238;
            puVar6 = (ulong *)(plVar3 + 2);
            if ((ulong *)*plVar3 == puVar6) {
              local_238 = *puVar6;
              lStack_230 = plVar3[3];
            }
            else {
              local_238 = *puVar6;
              local_248 = (ulong *)*plVar3;
            }
            local_240 = plVar3[1];
            *plVar3 = (long)puVar6;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            typeToString<int>(&local_108,t);
            uVar8 = 0xf;
            if (local_248 != &local_238) {
              uVar8 = local_238;
            }
            if (uVar8 < local_108._M_string_length + local_240) {
              uVar5 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p != &local_108.field_2) {
                uVar5 = local_108.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar5 < local_108._M_string_length + local_240) goto LAB_00458383;
              puVar4 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_108,0,(char *)0x0,(ulong)local_248);
            }
            else {
LAB_00458383:
              puVar4 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_248,(ulong)local_108._M_dataplus._M_p);
            }
            local_268 = &local_258;
            plVar3 = puVar4 + 2;
            if ((long *)*puVar4 == plVar3) {
              local_258 = *plVar3;
              uStack_250 = puVar4[3];
            }
            else {
              local_258 = *plVar3;
              local_268 = (long *)*puVar4;
            }
            local_260 = puVar4[1];
            *puVar4 = plVar3;
            puVar4[1] = 0;
            *(undefined1 *)plVar3 = 0;
            plVar3 = (long *)std::__cxx11::string::append((char *)&local_268);
            local_228 = &local_218;
            puVar6 = (ulong *)(plVar3 + 2);
            if ((ulong *)*plVar3 == puVar6) {
              local_218 = *puVar6;
              lStack_210 = plVar3[3];
            }
            else {
              local_218 = *puVar6;
              local_228 = (ulong *)*plVar3;
            }
            local_220 = plVar3[1];
            *plVar3 = (long)puVar6;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            typeToString<int>(&local_128,offset_);
            uVar8 = 0xf;
            if (local_228 != &local_218) {
              uVar8 = local_218;
            }
            if (uVar8 < local_128._M_string_length + local_220) {
              uVar5 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p != &local_128.field_2) {
                uVar5 = local_128.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar5 < local_128._M_string_length + local_220) goto LAB_004584c9;
              puVar4 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_128,0,(char *)0x0,(ulong)local_228);
            }
            else {
LAB_004584c9:
              puVar4 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_228,(ulong)local_128._M_dataplus._M_p);
            }
            local_288 = &local_278;
            plVar3 = puVar4 + 2;
            if ((long *)*puVar4 == plVar3) {
              local_278 = *plVar3;
              uStack_270 = puVar4[3];
            }
            else {
              local_278 = *plVar3;
              local_288 = (long *)*puVar4;
            }
            local_280 = puVar4[1];
            *puVar4 = plVar3;
            puVar4[1] = 0;
            *(undefined1 *)plVar3 = 0;
            plVar3 = (long *)std::__cxx11::string::append((char *)&local_288);
            local_1f8 = &local_1e8;
            puVar6 = (ulong *)(plVar3 + 2);
            if ((ulong *)*plVar3 == puVar6) {
              local_1e8 = *puVar6;
              lStack_1e0 = plVar3[3];
            }
            else {
              local_1e8 = *puVar6;
              local_1f8 = (ulong *)*plVar3;
            }
            local_1f0 = plVar3[1];
            *plVar3 = (long)puVar6;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            typeToString<int>(&local_148,iVar1);
            uVar8 = 0xf;
            if (local_1f8 != &local_1e8) {
              uVar8 = local_1e8;
            }
            if (uVar8 < local_148._M_string_length + local_1f0) {
              uVar5 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_dataplus._M_p != &local_148.field_2) {
                uVar5 = local_148.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar5 < local_148._M_string_length + local_1f0) goto LAB_00458616;
              puVar4 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_148,0,(char *)0x0,(ulong)local_1f8);
            }
            else {
LAB_00458616:
              puVar4 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_1f8,(ulong)local_148._M_dataplus._M_p);
            }
            plVar3 = puVar4 + 2;
            if ((long *)*puVar4 == plVar3) {
              local_1a8 = *plVar3;
              uStack_1a0 = puVar4[3];
              local_1b8 = &local_1a8;
            }
            else {
              local_1a8 = *plVar3;
              local_1b8 = (long *)*puVar4;
            }
            local_1b0 = puVar4[1];
            *puVar4 = plVar3;
            puVar4[1] = 0;
            *(undefined1 *)plVar3 = 0;
            plVar3 = (long *)std::__cxx11::string::append((char *)&local_1b8);
            local_1d8 = &local_1c8;
            puVar6 = (ulong *)(plVar3 + 2);
            if ((ulong *)*plVar3 == puVar6) {
              local_1c8 = *puVar6;
              lStack_1c0 = plVar3[3];
            }
            else {
              local_1c8 = *puVar6;
              local_1d8 = (ulong *)*plVar3;
            }
            local_1d0 = plVar3[1];
            *plVar3 = (long)puVar6;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            typeToString<int>(&local_168,iVar2);
            uVar8 = 0xf;
            if (local_1d8 != &local_1c8) {
              uVar8 = local_1c8;
            }
            if (uVar8 < local_168._M_string_length + local_1d0) {
              uVar5 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_168._M_dataplus._M_p != &local_168.field_2) {
                uVar5 = local_168.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar5 < local_168._M_string_length + local_1d0) goto LAB_00458768;
              puVar4 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_168,0,(char *)0x0,(ulong)local_1d8);
            }
            else {
LAB_00458768:
              puVar4 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_1d8,(ulong)local_168._M_dataplus._M_p);
            }
            plVar3 = puVar4 + 2;
            if ((long *)*puVar4 == plVar3) {
              local_188 = *plVar3;
              uStack_180 = puVar4[3];
              local_198 = &local_188;
            }
            else {
              local_188 = *plVar3;
              local_198 = (long *)*puVar4;
            }
            local_190 = puVar4[1];
            *puVar4 = plVar3;
            puVar4[1] = 0;
            *(undefined1 *)plVar3 = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
              operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_1d8 != &local_1c8) {
              operator_delete(local_1d8,local_1c8 + 1);
            }
            if (local_1b8 != &local_1a8) {
              operator_delete(local_1b8,local_1a8 + 1);
            }
            this_00 = local_e8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_1f8 != &local_1e8) {
              operator_delete(local_1f8,local_1e8 + 1);
            }
            if (local_288 != &local_278) {
              operator_delete(local_288,local_278 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_228 != &local_218) {
              operator_delete(local_228,local_218 + 1);
            }
            if (local_268 != &local_258) {
              operator_delete(local_268,local_258 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_248 != &local_238) {
              operator_delete(local_248,local_238 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if (!bVar9) {
              this_01 = (MultiVertexArrayTest *)operator_new(0xe0);
              deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                        (this_01,this_00->m_testCtx,(RenderContext *)this_00[1]._vptr_TestNode[1],
                         (Spec *)local_d8,(char *)local_198,(char *)local_198);
              tcu::TestNode::addChild(this_00,(TestNode *)this_01);
            }
            if (local_198 != &local_188) {
              operator_delete(local_198,local_188 + 1);
            }
            if (local_c8 != (pointer)0x0) {
              operator_delete(local_c8,(long)local_b8 - (long)local_c8);
            }
            lVar7 = 1;
            uVar5 = 0;
          } while ((local_1fc & 1) != 0);
          local_e0 = local_e0 + 1;
        } while (local_e0 != 3);
        local_170 = 1;
        uVar5 = 0;
      } while ((local_200 & 1) != 0);
      local_178 = 1;
      in_RAX = 0;
    } while ((local_204 & 1) != 0);
    local_290 = local_290 + 1;
    if (local_290 == 3) {
      return 0;
    }
  } while( true );
}

Assistant:

void SingleVertexArrayFirstTests::init (void)
{
	// Test strides with different input types, component counts and storage, Usage(?)
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_BYTE, Array::INPUTTYPE_FIXED};
	int					counts[]		= {5, 256};
	int					firsts[]		= {6, 24};
	int					offsets[]		= {1, 17};
	int					strides[]		= {/*0,*/ -1, 17, 32}; // Tread negative value as sizeof input. Same as 0, but done outside of GL.

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		for (int offsetNdx = 0; offsetNdx < DE_LENGTH_OF_ARRAY(offsets); offsetNdx++)
		{
			for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
			{
				for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
				{
					for (int firstNdx = 0; firstNdx < DE_LENGTH_OF_ARRAY(firsts); firstNdx++)
					{
						const int	stride	= (strides[strideNdx] < 0 ? Array::inputTypeSize(inputTypes[inputTypeNdx]) * 2 : strides[strideNdx]);
						const bool	aligned	= ((stride % Array::inputTypeSize(inputTypes[inputTypeNdx])) == 0) && (offsets[offsetNdx] % Array::inputTypeSize(inputTypes[inputTypeNdx]) == 0);

						MultiVertexArrayTest::Spec::ArraySpec arraySpec(inputTypes[inputTypeNdx],
																		Array::OUTPUTTYPE_VEC2,
																		Array::STORAGE_BUFFER,
																		Array::USAGE_DYNAMIC_DRAW,
																		2,
																		offsets[offsetNdx],
																		stride,
																		false,
																		GLValue::getMinValue(inputTypes[inputTypeNdx]),
																		GLValue::getMaxValue(inputTypes[inputTypeNdx]));

						MultiVertexArrayTest::Spec spec;
						spec.primitive	= Array::PRIMITIVE_TRIANGLES;
						spec.drawCount	= counts[countNdx];
						spec.first		= firsts[firstNdx];
						spec.arrays.push_back(arraySpec);

						std::string name = Array::inputTypeToString(inputTypes[inputTypeNdx]) + "_first" + typeToString(firsts[firstNdx]) + "_offset" + typeToString(offsets[offsetNdx]) + "_stride" + typeToString(stride) + "_quads" + typeToString(counts[countNdx]);
						if (!aligned)
							addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
					}
				}
			}
		}
	}
}